

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O0

TextureLevel *
deqp::gles31::Functional::anon_unknown_0::getPixels
          (TextureLevel *__return_storage_ptr__,RenderContext *renderCtx,IVec2 *size,
          TextureFormat *colorBufferFormat)

{
  IVec2 *pIVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  PixelBufferAccess local_110;
  PixelBufferAccess local_e8;
  PixelBufferAccess local_c0;
  TextureFormat local_98;
  undefined1 local_90 [8];
  TextureLevel readResult;
  bool isSigned;
  PixelBufferAccess local_58;
  undefined1 local_29;
  TextureFormat *local_28;
  TextureFormat *colorBufferFormat_local;
  IVec2 *size_local;
  RenderContext *renderCtx_local;
  TextureLevel *result;
  
  local_29 = 0;
  local_28 = colorBufferFormat;
  colorBufferFormat_local = (TextureFormat *)size;
  size_local = (IVec2 *)renderCtx;
  renderCtx_local = (RenderContext *)__return_storage_ptr__;
  iVar3 = tcu::Vector<int,_2>::x(size);
  iVar4 = tcu::Vector<int,_2>::y((Vector<int,_2> *)colorBufferFormat_local);
  tcu::TextureLevel::TextureLevel(__return_storage_ptr__,colorBufferFormat,iVar3,iVar4,1);
  pIVar1 = size_local;
  if ((local_28->order == RGBA) &&
     (((local_28->type == UNORM_INT8 || (local_28->type == SIGNED_INT32)) ||
      (local_28->type == UNSIGNED_INT32)))) {
    tcu::TextureLevel::getAccess(&local_58,__return_storage_ptr__);
    glu::readPixels((RenderContext *)pIVar1,0,0,&local_58);
  }
  else if ((local_28->order == RGBA) &&
          ((bVar2 = isSIntFormatType(local_28->type), bVar2 ||
           (bVar2 = isUIntFormatType(local_28->type), bVar2)))) {
    readResult.m_data.m_cap._3_1_ = isSIntFormatType(local_28->type);
    tcu::TextureFormat::TextureFormat
              (&local_98,RGBA,((byte)~readResult.m_data.m_cap._3_1_ & 1) * 4 + SIGNED_INT32);
    iVar3 = tcu::Vector<int,_2>::x((Vector<int,_2> *)colorBufferFormat_local);
    iVar4 = tcu::Vector<int,_2>::y((Vector<int,_2> *)colorBufferFormat_local);
    tcu::TextureLevel::TextureLevel((TextureLevel *)local_90,&local_98,iVar3,iVar4,1);
    pIVar1 = size_local;
    tcu::TextureLevel::getAccess(&local_c0,(TextureLevel *)local_90);
    glu::readPixels((RenderContext *)pIVar1,0,0,&local_c0);
    tcu::TextureLevel::getAccess(&local_e8,__return_storage_ptr__);
    tcu::TextureLevel::getAccess(&local_110,(TextureLevel *)local_90);
    tcu::copy((EVP_PKEY_CTX *)&local_e8,(EVP_PKEY_CTX *)&local_110);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

static tcu::TextureLevel getPixels (const glu::RenderContext& renderCtx, const IVec2& size, const tcu::TextureFormat& colorBufferFormat)
{
	tcu::TextureLevel result(colorBufferFormat, size.x(), size.y());

	// only a few pixel formats are guaranteed to be valid targets for readPixels, convert the rest
	if (colorBufferFormat.order == tcu::TextureFormat::RGBA &&
		(colorBufferFormat.type == tcu::TextureFormat::UNORM_INT8	||
		 colorBufferFormat.type == tcu::TextureFormat::SIGNED_INT32	||
		 colorBufferFormat.type == tcu::TextureFormat::UNSIGNED_INT32))
	{
		// valid as is
		glu::readPixels(renderCtx, 0, 0, result.getAccess());
	}
	else if (colorBufferFormat.order == tcu::TextureFormat::RGBA &&
			 (isSIntFormatType(colorBufferFormat.type) ||
			  isUIntFormatType(colorBufferFormat.type)))
	{
		// signed and unsigned integers must be read using 32-bit values
		const bool			isSigned	= isSIntFormatType(colorBufferFormat.type);
		tcu::TextureLevel	readResult	(tcu::TextureFormat(tcu::TextureFormat::RGBA,
														    (isSigned) ? (tcu::TextureFormat::SIGNED_INT32) : (tcu::TextureFormat::UNSIGNED_INT32)),
										 size.x(),
										 size.y());

		glu::readPixels(renderCtx, 0, 0, readResult.getAccess());
		tcu::copy(result.getAccess(), readResult.getAccess());
	}
	else
	{
		// unreadable format
		DE_ASSERT(false);
	}

	return result;
}